

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextVkImpl::InsertDebugLabel(DeviceContextVkImpl *this,Char *Label,float *pColor)

{
  undefined1 local_48 [8];
  VkDebugUtilsLabelEXT Info;
  float *pColor_local;
  Char *Label_local;
  DeviceContextVkImpl *this_local;
  
  Info.color._8_8_ = pColor;
  DeviceContextBase<Diligent::EngineVkImplTraits>::InsertDebugLabel
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,Label,pColor,0);
  memset(local_48,0,0x28);
  local_48._0_4_ = VK_STRUCTURE_TYPE_DEBUG_UTILS_LABEL_EXT;
  if (Info.color._8_8_ != 0) {
    Info.pLabelName = *(char **)Info.color._8_8_;
    Info.color._0_8_ = *(undefined8 *)(Info.color._8_8_ + 8);
  }
  Info.pNext = Label;
  EnsureVkCmdBuffer(this);
  VulkanUtilities::VulkanCommandBuffer::InsertDebugUtilsLabel
            (&this->m_CommandBuffer,(VkDebugUtilsLabelEXT *)local_48);
  return;
}

Assistant:

void DeviceContextVkImpl::InsertDebugLabel(const Char* Label, const float* pColor)
{
    TDeviceContextBase::InsertDebugLabel(Label, pColor, 0);

    VkDebugUtilsLabelEXT Info{};
    Info.sType      = VK_STRUCTURE_TYPE_DEBUG_UTILS_LABEL_EXT;
    Info.pLabelName = Label;

    if (pColor != nullptr)
        memcpy(Info.color, pColor, sizeof(Info.color));

    EnsureVkCmdBuffer();
    m_CommandBuffer.InsertDebugUtilsLabel(Info);
}